

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall AggressiveBotStrategy::fortifyFromCountryIndex(AggressiveBotStrategy *this)

{
  int iVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  size_type sVar3;
  reference ppCVar4;
  int local_1c;
  int local_18;
  int i;
  int numTroops;
  int fromCountryIndex;
  AggressiveBotStrategy *this_local;
  
  i = 0;
  local_18 = 9999;
  local_1c = 0;
  while( true ) {
    pvVar2 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
    sVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar2);
    if (sVar3 <= (ulong)(long)local_1c) break;
    pvVar2 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
    ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (pvVar2,(long)local_1c);
    iVar1 = Map::Country::getNumberOfTroops(*ppCVar4);
    if (iVar1 < local_18) {
      pvVar2 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
      ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (pvVar2,(long)local_1c);
      iVar1 = Map::Country::getNumberOfTroops(*ppCVar4);
      if (1 < iVar1) {
        i = local_1c;
        pvVar2 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
        ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pvVar2,(long)local_1c);
        local_18 = Map::Country::getNumberOfTroops(*ppCVar4);
        pvVar2 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
        ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pvVar2,(long)local_1c);
        (this->super_PlayerStrategy).from = *ppCVar4;
      }
    }
    local_1c = local_1c + 1;
  }
  return i;
}

Assistant:

int AggressiveBotStrategy::fortifyFromCountryIndex() {
    int fromCountryIndex = 0;
    int numTroops = 9999;
    for (int i = 0; i < player->getOwnedCountries()->size(); i++) {
        if (player->getOwnedCountries()->at(i)->getNumberOfTroops() < numTroops && player->getOwnedCountries()->at(i)->getNumberOfTroops() > 1) {
            fromCountryIndex = i;
            numTroops = player->getOwnedCountries()->at(i)->getNumberOfTroops();
            from = player->getOwnedCountries()->at(i);
        }
    }
    return fromCountryIndex;
}